

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

bool open_prog_mudschool_key(ROOM_INDEX_DATA *room,CHAR_DATA *ch,EXIT_DATA *exit)

{
  long in_RDX;
  long in_RSI;
  __type_conflict2 _Var1;
  bool found;
  OBJ_DATA *obj2;
  OBJ_DATA *obj;
  int in_stack_0000006c;
  OBJ_INDEX_DATA *in_stack_00000070;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  OBJ_DATA *obj_00;
  undefined4 in_stack_ffffffffffffffc8;
  uint3 in_stack_ffffffffffffffcc;
  uint vnum;
  char *txt;
  bool local_1;
  
  vnum = (uint)in_stack_ffffffffffffffcc;
  txt = *(char **)(in_RSI + 0x98);
  do {
    if (txt == (char *)0x0) {
LAB_006bdd7e:
      if ((char)(vnum >> 0x18) == '\0') {
        obj_00 = *(OBJ_DATA **)(in_RDX + 8);
        _Var1 = std::pow<int,int>(0,0x6bdda9);
        if (((ulong)obj_00 & (long)_Var1) == 0) {
          local_1 = true;
        }
        else {
          get_obj_index(vnum);
          create_object(in_stack_00000070,in_stack_0000006c);
          send_to_char(txt,(CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffc8));
          obj_to_char(obj_00,in_stack_ffffffffffffffb8);
          act(txt,(CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffc8),obj_00,
              in_stack_ffffffffffffffb8,0);
          act(txt,(CHAR_DATA *)CONCAT44(vnum,in_stack_ffffffffffffffc8),obj_00,
              in_stack_ffffffffffffffb8,0);
          local_1 = false;
        }
      }
      else {
        local_1 = true;
      }
      return local_1;
    }
    if (*(short *)(*(long *)(txt + 0x50) + 0x50) == 0x6014) {
      vnum = CONCAT13(1,in_stack_ffffffffffffffcc);
      goto LAB_006bdd7e;
    }
    txt = *(char **)(txt + 8);
  } while( true );
}

Assistant:

bool open_prog_mudschool_key(ROOM_INDEX_DATA *room, CHAR_DATA *ch, EXIT_DATA *exit)
{
	OBJ_DATA *obj, *obj2;
	bool found= false;

	for (obj2 = ch->carrying; obj2 != nullptr; obj2 = obj2->next_content)
	{
		if (obj2->pIndexData->vnum == 24596)
		{
			found = true;
			break;
		}
	}

	if (found)
		return true;

	if (!IS_SET(exit->exit_info, EX_LOCKED))
		return true;

	obj = create_object(get_obj_index(24596), 1);
	send_to_char("It's locked...\n\r", ch);
	obj_to_char(obj, ch);
	act("With a sudden flash of lavender light, a pudgy hand pops into existence and gives you a key!", ch, 0, 0, TO_CHAR);
	act("With a sudden flash of lavender light, a pudgy hand pops into existence gives $n a key!", ch, 0, 0, TO_ROOM);

	return false;
}